

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmGhsMultiTargetGenerator::WriteBuildEventsHelper
          (cmGhsMultiTargetGenerator *this,ostream *fout,
          vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *ccv,string *name,string *cmd)

{
  cmCustomCommand *pcVar1;
  pointer pbVar2;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  cmCustomCommand *cc;
  string *a;
  ostream *poVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *byp;
  pointer pbVar5;
  char *pcVar6;
  undefined8 uVar7;
  undefined5 in_stack_fffffffffffffaf8;
  char in_stack_fffffffffffffafd;
  char in_stack_fffffffffffffafe;
  char in_stack_fffffffffffffaff;
  int iVar8;
  int in_stack_fffffffffffffb04;
  string fname;
  _Any_data local_4a8;
  undefined8 local_498;
  undefined8 uStack_490;
  string shell;
  string fext;
  string local_440;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_420;
  cmCustomCommandGenerator ccg;
  cmGeneratedFileStream f;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&fext,".sh",(allocator<char> *)&f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shell,"/bin/sh ",(allocator<char> *)&f);
  cc = (ccv->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
       super__Vector_impl_data._M_start;
  pcVar1 = (ccv->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar8 = 0;
  while( true ) {
    if (cc == pcVar1) break;
    uVar7 = 0x3fccc2;
    std::__cxx11::string::string((string *)&local_440,(string *)&this->ConfigName);
    local_420._M_engaged = false;
    local_4a8._M_unused._M_object = (void *)0x0;
    local_4a8._8_8_ = 0;
    local_498 = 0;
    uStack_490 = 0;
    computeInternalDepfile.super__Function_base._M_functor._8_8_ = uVar7;
    computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object = &local_4a8;
    computeInternalDepfile.super__Function_base._M_manager._0_5_ = in_stack_fffffffffffffaf8;
    computeInternalDepfile.super__Function_base._M_manager._5_1_ = in_stack_fffffffffffffafd;
    computeInternalDepfile.super__Function_base._M_manager._6_1_ = in_stack_fffffffffffffafe;
    computeInternalDepfile.super__Function_base._M_manager._7_1_ = in_stack_fffffffffffffaff;
    computeInternalDepfile._M_invoker._0_4_ = iVar8;
    computeInternalDepfile._M_invoker._4_4_ = in_stack_fffffffffffffb04;
    cmCustomCommandGenerator::cmCustomCommandGenerator
              (&ccg,cc,&local_440,&this->LocalGenerator->super_cmLocalGenerator,true,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_420,computeInternalDepfile);
    std::_Function_base::~_Function_base((_Function_base *)&local_4a8);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_420);
    std::__cxx11::string::~string((string *)&local_440);
    a = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                  (&this->LocalGenerator->super_cmLocalGenerator);
    in_stack_fffffffffffffaff = '/';
    (*(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter
      [0x10])((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
              this->LocalGenerator,this->GeneratorTarget);
    in_stack_fffffffffffffafe = '/';
    in_stack_fffffffffffffafd = '_';
    in_stack_fffffffffffffb04 = iVar8;
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char,std::__cxx11::string_const&,int,std::__cxx11::string&>
              (&fname,a,&stack0xfffffffffffffaff,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
               &stack0xfffffffffffffafe,&this->Name,&stack0xfffffffffffffafd,name,
               (int *)&stack0xfffffffffffffb04,&fext);
    std::__cxx11::string::~string((string *)&f);
    cmGeneratedFileStream::cmGeneratedFileStream(&f,&fname,false,None);
    cmGeneratedFileStream::SetCopyIfDifferent(&f,true);
    WriteCustomCommandsHelper(this,(ostream *)&f,&ccg);
    cmGeneratedFileStream::Close(&f);
    if (this->TagType == CUSTOM_TARGET) {
      poVar3 = std::operator<<(fout,(string *)&fname);
      poVar3 = std::operator<<(poVar3,"\n    :outputName=\"");
      poVar3 = std::operator<<(poVar3,(string *)&fname);
      pcVar6 = ".rule\"\n";
    }
    else {
      poVar3 = std::operator<<(fout,"    :");
      poVar3 = std::operator<<(poVar3,(string *)cmd);
      poVar3 = std::operator<<(poVar3,"=\"");
      poVar3 = std::operator<<(poVar3,(string *)&shell);
      poVar3 = std::operator<<(poVar3,(string *)&fname);
      pcVar6 = "\"\n";
    }
    std::operator<<(poVar3,pcVar6);
    pvVar4 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(&ccg);
    iVar8 = iVar8 + 1;
    pbVar2 = (pvVar4->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar5 = (pvVar4->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar2; pbVar5 = pbVar5 + 1)
    {
      poVar3 = std::operator<<(fout,"    :extraOutputFile=\"");
      poVar3 = std::operator<<(poVar3,(string *)pbVar5);
      std::operator<<(poVar3,"\"\n");
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&f);
    std::__cxx11::string::~string((string *)&fname);
    cmCustomCommandGenerator::~cmCustomCommandGenerator(&ccg);
    cc = cc + 1;
  }
  std::__cxx11::string::~string((string *)&shell);
  std::__cxx11::string::~string((string *)&fext);
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteBuildEventsHelper(
  std::ostream& fout, const std::vector<cmCustomCommand>& ccv,
  std::string const& name, std::string const& cmd)
{
  int cmdcount = 0;
#ifdef _WIN32
  std::string fext = ".bat";
  std::string shell;
#else
  std::string fext = ".sh";
  std::string shell = "/bin/sh ";
#endif

  for (cmCustomCommand const& cc : ccv) {
    cmCustomCommandGenerator ccg(cc, this->ConfigName, this->LocalGenerator);
    // Open the filestream for this custom command
    std::string fname =
      cmStrCat(this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
               this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
               '/', this->Name, '_', name, cmdcount++, fext);

    cmGeneratedFileStream f(fname);
    f.SetCopyIfDifferent(true);
    this->WriteCustomCommandsHelper(f, ccg);
    f.Close();
    if (this->TagType != GhsMultiGpj::CUSTOM_TARGET) {
      fout << "    :" << cmd << "=\"" << shell << fname << "\"\n";
    } else {
      fout << fname << "\n    :outputName=\"" << fname << ".rule\"\n";
    }
    for (const auto& byp : ccg.GetByproducts()) {
      fout << "    :extraOutputFile=\"" << byp << "\"\n";
    }
  }
}